

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Vector<capnp::json::Value::Field::Reader>::~Vector
          (Vector<capnp::json::Value::Field::Reader> *this)

{
  Reader *pRVar1;
  RemoveConst<capnp::json::Value::Field::Reader> *pRVar2;
  Reader *pRVar3;
  ArrayDisposer *pAVar4;
  
  pRVar1 = (this->builder).ptr;
  if (pRVar1 != (Reader *)0x0) {
    pRVar2 = (this->builder).pos;
    pRVar3 = (this->builder).endPtr;
    (this->builder).ptr = (Reader *)0x0;
    (this->builder).pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
    (this->builder).endPtr = (Reader *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pRVar1,0x30,((long)pRVar2 - (long)pRVar1 >> 4) * -0x5555555555555555,
               ((long)pRVar3 - (long)pRVar1 >> 4) * -0x5555555555555555,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }